

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  FastFieldValuePrinter *pFVar1;
  bool bVar2;
  pointer ppMVar3;
  pointer ppMVar4;
  bool bVar5;
  int iVar6;
  _Rb_tree_header *p_Var7;
  Message *message_00;
  _Base_ptr p_Var8;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar9;
  iterator __begin3;
  char *pcVar10;
  uint field_index;
  ulong uVar11;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  sorted_map_field;
  uint local_9c;
  FieldDescriptor *local_78;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *local_70;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_68;
  _Rb_tree_header *local_48;
  FieldDescriptor *local_40;
  ulong local_38;
  
  if ((this->use_short_repeated_primitives_ == true) && ((~(byte)field[1] & 0x60) == 0)) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_68.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)FieldDescriptor::TypeOnceInit;
      local_78 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_78);
    }
    iVar6 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    if (iVar6 != 9) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_68.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)FieldDescriptor::TypeOnceInit;
        local_78 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                   &local_78);
        iVar6 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
      }
      if (iVar6 != 10) {
        PrintShortRepeatedField(this,message,reflection,field,generator);
        return;
      }
    }
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    local_9c = Reflection::FieldSize(reflection,message,field);
  }
  else {
    bVar5 = Reflection::HasField(reflection,message,field);
    if ((bVar5) ||
       (local_9c = 0, *(char *)(*(long *)(*(long *)(field + 0x20) + 0x20) + 0x4b) == '\x01')) {
      local_9c = 1;
    }
  }
  local_68.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_78 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_78,&local_40)
    ;
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar5 = FieldDescriptor::is_map_message_type(field), bVar5)) {
    bVar5 = internal::MapFieldPrinterHelper::SortMap(message,reflection,field,&local_68);
    bVar2 = true;
  }
  else {
    bVar2 = false;
    bVar5 = false;
  }
  if (0 < (int)local_9c) {
    local_48 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    local_70 = &this->default_field_value_printer_;
    local_38 = (ulong)local_9c;
    uVar11 = 0;
    do {
      field_index = -(uint)((~(byte)field[1] & 0x60) != 0) | (uint)uVar11;
      PrintFieldName(this,message,field_index,local_9c,reflection,field,generator);
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_78 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_40 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_78,
                   &local_40);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 10) {
        p_Var8 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = local_48;
        puVar9 = local_70;
        if (p_Var8 != (_Base_ptr)0x0) {
          do {
            if (*(FieldDescriptor **)(p_Var8 + 1) >= field) {
              p_Var7 = (_Rb_tree_header *)p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(FieldDescriptor **)(p_Var8 + 1) < field];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((p_Var7 != local_48) &&
             (puVar9 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                        *)(p_Var7 + 1), field < (FieldDescriptor *)p_Var7->_M_node_count)) {
            puVar9 = local_70;
          }
        }
        pFVar1 = (puVar9->_M_t).
                 super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                 .
                 super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
                 ._M_head_impl;
        if ((~(byte)field[1] & 0x60) == 0) {
          if (bVar2) {
            message_00 = local_68.
                         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11];
          }
          else {
            message_00 = Reflection::GetRepeatedMessage(reflection,message,field,(uint)uVar11);
          }
        }
        else {
          message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
        }
        (*pFVar1->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar1,message_00,(ulong)field_index,(ulong)local_9c,
                   (ulong)this->single_line_mode_,generator);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        iVar6 = (*pFVar1->_vptr_FastFieldValuePrinter[0xf])
                          (pFVar1,message_00,(ulong)field_index,(ulong)local_9c,
                           (ulong)this->single_line_mode_,generator);
        if ((char)iVar6 == '\0') {
          Print(this,message_00,generator);
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[3])(generator);
        (*pFVar1->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar1,message_00,(ulong)field_index,(ulong)local_9c,
                   (ulong)this->single_line_mode_,generator);
      }
      else {
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        if (generator->insert_silent_marker_ == true) {
          generator->insert_silent_marker_ = false;
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,"\t ",2);
        }
        PrintFieldValue(this,message,reflection,field,field_index,generator);
        pcVar10 = "\n";
        if (this->single_line_mode_ != false) {
          pcVar10 = " ";
        }
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,pcVar10,1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_38);
  }
  ppMVar4 = local_68.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppMVar3 = local_68.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (bVar5 != false) {
    for (; ppMVar3 != ppMVar4; ppMVar3 = ppMVar3 + 1) {
      if (*ppMVar3 != (Message *)0x0) {
        (*((*ppMVar3)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
  }
  if (local_68.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator* generator) const {
  if (use_short_repeated_primitives_ && field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field) ||
             field->containing_type()->options().map_entry()) {
    count = 1;
  }

  std::vector<const Message*> sorted_map_field;
  bool need_release = false;
  bool is_map = field->is_map();
  if (is_map) {
    need_release = internal::MapFieldPrinterHelper::SortMap(
        message, reflection, field, &sorted_map_field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, field_index, count, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FastFieldValuePrinter* printer = GetFieldPrinter(field);
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *sorted_map_field[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      printer->PrintMessageStart(sub_message, field_index, count,
                                 single_line_mode_, generator);
      generator->Indent();
      if (!printer->PrintMessageContent(sub_message, field_index, count,
                                        single_line_mode_, generator)) {
        Print(sub_message, generator);
      }
      generator->Outdent();
      printer->PrintMessageEnd(sub_message, field_index, count,
                               single_line_mode_, generator);
    } else {
      generator->PrintMaybeWithMarker(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator->PrintLiteral(" ");
      } else {
        generator->PrintLiteral("\n");
      }
    }
  }

  if (need_release) {
    for (const Message* message_to_delete : sorted_map_field) {
      delete message_to_delete;
    }
  }
}